

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_set_authorizer
              (sqlite3 *db,_func_int_void_ptr_int_char_ptr_char_ptr_char_ptr_char_ptr *xAuth,
              void *pArg)

{
  Vdbe *pVVar1;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  db->xAuth = xAuth;
  db->pAuthArg = pArg;
  for (pVVar1 = db->pVdbe; pVVar1 != (Vdbe *)0x0; pVVar1 = pVVar1->pNext) {
    *(ushort *)&pVVar1->field_0xc5 = (*(ushort *)&pVVar1->field_0xc5 & 0xfffc) + 1;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_set_authorizer(
  sqlite3 *db,
  int (*xAuth)(void*,int,const char*,const char*,const char*,const char*),
  void *pArg
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  db->xAuth = (sqlite3_xauth)xAuth;
  db->pAuthArg = pArg;
  sqlite3ExpirePreparedStatements(db, 0);
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}